

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntaxAnalysis.cpp
# Opt level: O0

int constDefineInt(function *fn)

{
  int l_00;
  byte bVar1;
  size_type sVar2;
  reference pvVar3;
  undefined1 local_f8 [64];
  undefined1 local_b8 [8];
  Identifier con;
  string local_38 [8];
  string id;
  int l;
  function *fn_local;
  
  getToken();
  sVar2 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::size(&formerAns_abi_cxx11_);
  pvVar3 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::at(&formerAns_abi_cxx11_,~(long)tokenPointer + sVar2);
  l_00 = pvVar3->second;
  sVar2 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::size(&formerAns_abi_cxx11_);
  pvVar3 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::at(&formerAns_abi_cxx11_,~(long)tokenPointer + sVar2);
  std::__cxx11::string::string(local_38,(string *)pvVar3);
  getToken();
  getToken();
  integer(0,1);
  std::__cxx11::string::string((string *)(local_f8 + 0x20),local_38);
  Identifier::Identifier((Identifier *)local_b8,(string *)(local_f8 + 0x20),INTTK);
  std::__cxx11::string::~string((string *)(local_f8 + 0x20));
  Identifier::setValue((Identifier *)local_b8,num);
  Identifier::setDimension((Identifier *)local_b8,1,1);
  Identifier::setDimension((Identifier *)local_b8,2,1);
  Identifier::setIdentifierCategory((Identifier *)local_b8,CONST);
  tokenType::getName_abi_cxx11_((tokenType *)local_f8);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)local_f8);
  if ((bVar1 & 1) == 0) {
    function::addToken(fn,(Identifier *)local_b8,l_00);
  }
  else {
    identityTable::addToken(&globalTable,(Identifier *)local_b8,l_00);
  }
  getToken();
  Identifier::~Identifier((Identifier *)local_b8);
  std::__cxx11::string::~string(local_38);
  return 1;
}

Assistant:

int constDefineInt(function &fn) {
    getToken();//IDENFR
    int l = formerAns.at(formerAns.size() - 1 - tokenPointer).second;
    string id = formerAns.at(formerAns.size() - 1 - tokenPointer).first;
    getToken();//ASSIGN
    getToken();
    integer(0, 1);
    Identifier con(id, INTTK);
    con.setValue(num);
    con.setDimension(1, 1);
    con.setDimension(2, 1);
    con.setIdentifierCategory(CONST);
    if (fn.getName().empty())
        globalTable.addToken(con, l);
    else
        fn.addToken(con, l);
    getToken();
    return 1;
}